

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::emitDelegate(BinaryInstWriter *this,Try *curr)

{
  pointer pNVar1;
  U32LEB x;
  BufferWithRandomAccess *this_00;
  size_t sVar2;
  Name name;
  
  pNVar1 = (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start != pNVar1) {
    (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar1 + -1;
    sVar2 = 0x18;
    this_00 = BufferWithRandomAccess::operator<<(this->o,'\x18');
    name.super_IString.str._M_str = (curr->delegateTarget).super_IString.str._M_str;
    name.super_IString.str._M_len = sVar2;
    x.value = getBreakIndex(this,name);
    BufferWithRandomAccess::operator<<(this_00,x);
    return;
  }
  __assert_fail("!breakStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                ,0x881,"void wasm::BinaryInstWriter::emitDelegate(Try *)");
}

Assistant:

void BinaryInstWriter::emitDelegate(Try* curr) {
  // The delegate ends the scope in effect, and pops the try's name. Note that
  // the getBreakIndex is intentionally after that pop, as the delegate cannot
  // target its own try.
  assert(!breakStack.empty());
  breakStack.pop_back();
  o << int8_t(BinaryConsts::Delegate)
    << U32LEB(getBreakIndex(curr->delegateTarget));
}